

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

cgltf_result cgltf_validate(cgltf_data *data)

{
  cgltf_component_type cVar1;
  cgltf_buffer_view *pcVar2;
  cgltf_buffer_view *pcVar3;
  cgltf_mesh *pcVar4;
  cgltf_primitive *pcVar5;
  cgltf_size cVar6;
  cgltf_accessor *pcVar7;
  cgltf_accessor *pcVar8;
  cgltf_animation_sampler *pcVar9;
  cgltf_size cVar10;
  cgltf_size *pcVar11;
  cgltf_size i;
  cgltf_size cVar12;
  cgltf_accessor **ppcVar13;
  cgltf_node *pcVar14;
  long lVar15;
  cgltf_size cVar16;
  cgltf_node *pcVar17;
  cgltf_size cVar18;
  cgltf_animation_path_type *pcVar19;
  cgltf_size cVar20;
  cgltf_size cVar21;
  
  cVar20 = data->accessors_count;
  if (cVar20 != 0) {
    pcVar11 = &(data->accessors->sparse).values_byte_offset;
    do {
      cVar10 = cgltf_calc_size(*(cgltf_type *)(pcVar11 + -0x1c),
                               *(cgltf_component_type *)(pcVar11 + -0x1d));
      if ((pcVar11[-0x18] != 0) &&
         (*(ulong *)(pcVar11[-0x18] + 0x10) <
          pcVar11[-0x1b] + cVar10 + (pcVar11[-0x1a] + -1) * pcVar11[-0x19])) {
        return cgltf_result_data_too_short;
      }
      if ((int)pcVar11[-6] != 0) {
        cVar1 = *(cgltf_component_type *)(pcVar11 + -2);
        if (cVar1 - cgltf_component_type_r_8 < 6) {
          lVar15 = *(long *)(&DAT_0017a798 + (ulong)(cVar1 - cgltf_component_type_r_8) * 8);
        }
        else {
          lVar15 = 0;
        }
        pcVar2 = (cgltf_buffer_view *)pcVar11[-4];
        if (pcVar2->size < lVar15 * ((cgltf_accessor_sparse *)(pcVar11 + -5))->count + pcVar11[-3])
        {
          return cgltf_result_data_too_short;
        }
        if (((cgltf_buffer_view *)pcVar11[-1])->size <
            cVar10 * ((cgltf_accessor_sparse *)(pcVar11 + -5))->count + *pcVar11) {
          return cgltf_result_data_too_short;
        }
        if (cgltf_component_type_r_32u < cVar1) {
          return cgltf_result_invalid_gltf;
        }
        if ((0x34U >> (cVar1 & 0x1f) & 1) == 0) {
          return cgltf_result_invalid_gltf;
        }
        pcVar3 = (cgltf_buffer_view *)pcVar2->buffer->data;
        if ((pcVar3 != (cgltf_buffer_view *)0x0) &&
           (cVar10 = cgltf_calc_index_bound
                               (pcVar3,pcVar2->offset,(cgltf_component_type)pcVar11[-3],(ulong)cVar1
                               ), pcVar11[-0x1a] <= cVar10)) {
          return cgltf_result_data_too_short;
        }
      }
      pcVar11 = pcVar11 + 0x26;
      cVar20 = cVar20 - 1;
    } while (cVar20 != 0);
  }
  cVar20 = data->buffer_views_count;
  if (cVar20 != 0) {
    pcVar11 = &data->buffer_views->size;
    do {
      if ((((cgltf_buffer_view *)(pcVar11 + -2))->buffer != (cgltf_buffer *)0x0) &&
         (((cgltf_buffer_view *)(pcVar11 + -2))->buffer->size < *pcVar11 + pcVar11[-1])) {
        return cgltf_result_data_too_short;
      }
      pcVar11 = pcVar11 + 7;
      cVar20 = cVar20 - 1;
    } while (cVar20 != 0);
  }
  cVar20 = data->meshes_count;
  if (cVar20 != 0) {
    pcVar4 = data->meshes;
    cVar10 = 0;
    do {
      if (((pcVar4[cVar10].weights != (cgltf_float *)0x0) && (pcVar4[cVar10].primitives_count != 0))
         && ((pcVar4[cVar10].primitives)->targets_count != pcVar4[cVar10].weights_count)) {
        return cgltf_result_invalid_gltf;
      }
      cVar18 = pcVar4[cVar10].primitives_count;
      if (pcVar4[cVar10].target_names == (char **)0x0) {
        if (cVar18 != 0) goto LAB_00137e6d;
      }
      else if (cVar18 != 0) {
        if ((pcVar4[cVar10].primitives)->targets_count != pcVar4[cVar10].target_names_count) {
          return cgltf_result_invalid_gltf;
        }
LAB_00137e6d:
        pcVar5 = pcVar4[cVar10].primitives;
        cVar6 = pcVar5->targets_count;
        cVar21 = 0;
        do {
          if (pcVar5[cVar21].targets_count != cVar6) {
            return cgltf_result_invalid_gltf;
          }
          cVar12 = pcVar5[cVar21].attributes_count;
          if (cVar12 != 0) {
            pcVar7 = (pcVar5[cVar21].attributes)->data;
            ppcVar13 = &(pcVar5[cVar21].attributes)->data;
            do {
              if ((*ppcVar13)->count != pcVar7->count) {
                return cgltf_result_invalid_gltf;
              }
              ppcVar13 = ppcVar13 + 3;
              cVar12 = cVar12 - 1;
            } while (cVar12 != 0);
            if (cVar6 != 0) {
              cVar12 = 0;
              do {
                cVar16 = pcVar5[cVar21].targets[cVar12].attributes_count;
                if (cVar16 != 0) {
                  ppcVar13 = &(pcVar5[cVar21].targets[cVar12].attributes)->data;
                  do {
                    if ((*ppcVar13)->count != pcVar7->count) {
                      return cgltf_result_invalid_gltf;
                    }
                    ppcVar13 = ppcVar13 + 3;
                    cVar16 = cVar16 - 1;
                  } while (cVar16 != 0);
                }
                cVar12 = cVar12 + 1;
              } while (cVar12 != cVar6);
            }
            pcVar8 = pcVar5[cVar21].indices;
            if (pcVar8 != (cgltf_accessor *)0x0) {
              cVar1 = pcVar8->component_type;
              if (cgltf_component_type_r_32u < cVar1) {
                return cgltf_result_invalid_gltf;
              }
              if ((0x34U >> (cVar1 & 0x1f) & 1) == 0) {
                return cgltf_result_invalid_gltf;
              }
              pcVar2 = pcVar8->buffer_view;
              if (((pcVar2 != (cgltf_buffer_view *)0x0) &&
                  (pcVar3 = (cgltf_buffer_view *)pcVar2->buffer->data,
                  pcVar3 != (cgltf_buffer_view *)0x0)) &&
                 (cVar12 = cgltf_calc_index_bound
                                     (pcVar3,pcVar2->offset,(cgltf_component_type)pcVar8->offset,
                                      (ulong)cVar1), pcVar7->count <= cVar12)) {
                return cgltf_result_data_too_short;
              }
            }
          }
          cVar21 = cVar21 + 1;
        } while (cVar21 != cVar18);
      }
      cVar10 = cVar10 + 1;
    } while (cVar10 != cVar20);
  }
  cVar20 = data->nodes_count;
  if (cVar20 != 0) {
    pcVar11 = &data->nodes->weights_count;
    cVar10 = cVar20;
    do {
      if ((((cgltf_float *)pcVar11[-1] != (cgltf_float *)0x0) &&
          (pcVar4 = (cgltf_mesh *)pcVar11[-4], pcVar4 != (cgltf_mesh *)0x0)) &&
         ((pcVar4->primitives_count != 0 && (pcVar4->primitives->targets_count != *pcVar11)))) {
        return cgltf_result_invalid_gltf;
      }
      pcVar11 = pcVar11 + 0x1b;
      cVar10 = cVar10 - 1;
    } while (cVar10 != 0);
    cVar10 = 0;
    do {
      pcVar14 = data->nodes[cVar10].parent;
      if (pcVar14 != (cgltf_node *)0x0) {
        for (pcVar17 = pcVar14->parent; pcVar17 != (cgltf_node *)0x0;
            pcVar17 = pcVar17->parent->parent) {
          if (pcVar14 == pcVar17) {
            return cgltf_result_invalid_gltf;
          }
          if ((pcVar17->parent == (cgltf_node *)0x0) ||
             (pcVar14 = pcVar14->parent, pcVar14 == (cgltf_node *)0x0)) break;
        }
      }
      cVar10 = cVar10 + 1;
    } while (cVar10 != cVar20);
  }
  if (data->scenes_count != 0) {
    cVar20 = 0;
    do {
      cVar10 = data->scenes[cVar20].nodes_count;
      if (cVar10 != 0) {
        cVar18 = 0;
        do {
          if (data->scenes[cVar20].nodes[cVar18]->parent != (cgltf_node *)0x0) {
            return cgltf_result_invalid_gltf;
          }
          cVar18 = cVar18 + 1;
        } while (cVar10 != cVar18);
      }
      cVar20 = cVar20 + 1;
    } while (cVar20 != data->scenes_count);
  }
  if (data->animations_count != 0) {
    cVar20 = 0;
    do {
      cVar10 = data->animations[cVar20].channels_count;
      if (cVar10 != 0) {
        pcVar19 = &(data->animations[cVar20].channels)->target_path;
        do {
          if (*(cgltf_node **)(pcVar19 + -2) != (cgltf_node *)0x0) {
            cVar18 = 1;
            if (*pcVar19 == cgltf_animation_path_type_weights) {
              pcVar4 = (*(cgltf_node **)(pcVar19 + -2))->mesh;
              if (pcVar4 == (cgltf_mesh *)0x0) {
                return cgltf_result_invalid_gltf;
              }
              if (pcVar4->primitives_count == 0) {
                return cgltf_result_invalid_gltf;
              }
              cVar18 = pcVar4->primitives->targets_count;
            }
            pcVar9 = ((cgltf_animation_channel *)(pcVar19 + -4))->sampler;
            if (cVar18 * pcVar9->input->count *
                ((ulong)(pcVar9->interpolation == cgltf_interpolation_type_cubic_spline) * 2 + 1) -
                pcVar9->output->count != 0) {
              return cgltf_result_data_too_short;
            }
          }
          pcVar19 = pcVar19 + 10;
          cVar10 = cVar10 - 1;
        } while (cVar10 != 0);
      }
      cVar20 = cVar20 + 1;
    } while (cVar20 != data->animations_count);
  }
  return cgltf_result_success;
}

Assistant:

cgltf_result cgltf_validate(cgltf_data* data)
{
    for (cgltf_size i = 0; i < data->accessors_count; ++i)
    {
        cgltf_accessor* accessor = &data->accessors[i];

        cgltf_size element_size = cgltf_calc_size(accessor->type, accessor->component_type);

        if (accessor->buffer_view)
        {
            cgltf_size req_size = accessor->offset + accessor->stride * (accessor->count - 1) + element_size;

            if (accessor->buffer_view->size < req_size)
            {
                return cgltf_result_data_too_short;
            }
        }

        if (accessor->is_sparse)
        {
            cgltf_accessor_sparse* sparse = &accessor->sparse;

            cgltf_size indices_component_size = cgltf_calc_size(cgltf_type_scalar, sparse->indices_component_type);
            cgltf_size indices_req_size = sparse->indices_byte_offset + indices_component_size * sparse->count;
            cgltf_size values_req_size = sparse->values_byte_offset + element_size * sparse->count;

            if (sparse->indices_buffer_view->size < indices_req_size ||
                sparse->values_buffer_view->size < values_req_size)
            {
                return cgltf_result_data_too_short;
            }

            if (sparse->indices_component_type != cgltf_component_type_r_8u &&
                sparse->indices_component_type != cgltf_component_type_r_16u &&
                sparse->indices_component_type != cgltf_component_type_r_32u)
            {
                return cgltf_result_invalid_gltf;
            }

            if (sparse->indices_buffer_view->buffer->data)
            {
                cgltf_size index_bound = cgltf_calc_index_bound(sparse->indices_buffer_view, sparse->indices_byte_offset, sparse->indices_component_type, sparse->count);

                if (index_bound >= accessor->count)
                {
                    return cgltf_result_data_too_short;
                }
            }
        }
    }

    for (cgltf_size i = 0; i < data->buffer_views_count; ++i)
    {
        cgltf_size req_size = data->buffer_views[i].offset + data->buffer_views[i].size;

        if (data->buffer_views[i].buffer && data->buffer_views[i].buffer->size < req_size)
        {
            return cgltf_result_data_too_short;
        }
    }

    for (cgltf_size i = 0; i < data->meshes_count; ++i)
    {
        if (data->meshes[i].weights)
        {
            if (data->meshes[i].primitives_count && data->meshes[i].primitives[0].targets_count != data->meshes[i].weights_count)
            {
                return cgltf_result_invalid_gltf;
            }
        }

        if (data->meshes[i].target_names)
        {
            if (data->meshes[i].primitives_count && data->meshes[i].primitives[0].targets_count != data->meshes[i].target_names_count)
            {
                return cgltf_result_invalid_gltf;
            }
        }

        for (cgltf_size j = 0; j < data->meshes[i].primitives_count; ++j)
        {
            if (data->meshes[i].primitives[j].targets_count != data->meshes[i].primitives[0].targets_count)
            {
                return cgltf_result_invalid_gltf;
            }

            if (data->meshes[i].primitives[j].attributes_count)
            {
                cgltf_accessor* first = data->meshes[i].primitives[j].attributes[0].data;

                for (cgltf_size k = 0; k < data->meshes[i].primitives[j].attributes_count; ++k)
                {
                    if (data->meshes[i].primitives[j].attributes[k].data->count != first->count)
                    {
                        return cgltf_result_invalid_gltf;
                    }
                }

                for (cgltf_size k = 0; k < data->meshes[i].primitives[j].targets_count; ++k)
                {
                    for (cgltf_size m = 0; m < data->meshes[i].primitives[j].targets[k].attributes_count; ++m)
                    {
                        if (data->meshes[i].primitives[j].targets[k].attributes[m].data->count != first->count)
                        {
                            return cgltf_result_invalid_gltf;
                        }
                    }
                }

                cgltf_accessor* indices = data->meshes[i].primitives[j].indices;

                if (indices &&
                    indices->component_type != cgltf_component_type_r_8u &&
                    indices->component_type != cgltf_component_type_r_16u &&
                    indices->component_type != cgltf_component_type_r_32u)
                {
                    return cgltf_result_invalid_gltf;
                }

                if (indices && indices->buffer_view && indices->buffer_view->buffer->data)
                {
                    cgltf_size index_bound = cgltf_calc_index_bound(indices->buffer_view, indices->offset, indices->component_type, indices->count);

                    if (index_bound >= first->count)
                    {
                        return cgltf_result_data_too_short;
                    }
                }
            }
        }
    }

    for (cgltf_size i = 0; i < data->nodes_count; ++i)
    {
        if (data->nodes[i].weights && data->nodes[i].mesh)
        {
            if (data->nodes[i].mesh->primitives_count && data->nodes[i].mesh->primitives[0].targets_count != data->nodes[i].weights_count)
            {
                return cgltf_result_invalid_gltf;
            }
        }
    }

    for (cgltf_size i = 0; i < data->nodes_count; ++i)
    {
        cgltf_node* p1 = data->nodes[i].parent;
        cgltf_node* p2 = p1 ? p1->parent : NULL;

        while (p1 && p2)
        {
            if (p1 == p2)
            {
                return cgltf_result_invalid_gltf;
            }

            p1 = p1->parent;
            p2 = p2->parent ? p2->parent->parent : NULL;
        }
    }

    for (cgltf_size i = 0; i < data->scenes_count; ++i)
    {
        for (cgltf_size j = 0; j < data->scenes[i].nodes_count; ++j)
        {
            if (data->scenes[i].nodes[j]->parent)
            {
                return cgltf_result_invalid_gltf;
            }
        }
    }

    for (cgltf_size i = 0; i < data->animations_count; ++i)
    {
        for (cgltf_size j = 0; j < data->animations[i].channels_count; ++j)
        {
            cgltf_animation_channel* channel = &data->animations[i].channels[j];

            if (!channel->target_node)
            {
                continue;
            }

            cgltf_size components = 1;

            if (channel->target_path == cgltf_animation_path_type_weights)
            {
                if (!channel->target_node->mesh || !channel->target_node->mesh->primitives_count)
                {
                    return cgltf_result_invalid_gltf;
                }

                components = channel->target_node->mesh->primitives[0].targets_count;
            }

            cgltf_size values = channel->sampler->interpolation == cgltf_interpolation_type_cubic_spline ? 3 : 1;

            if (channel->sampler->input->count * components * values != channel->sampler->output->count)
            {
                return cgltf_result_data_too_short;
            }
        }
    }

    return cgltf_result_success;
}